

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O2

ON_SubDEdgeType __thiscall ON_SubDEdge::EdgeType(ON_SubDEdge *this)

{
  float fVar1;
  ON_SubDEdgeTag OVar2;
  ushort uVar3;
  ON_SubDEdgeType OVar4;
  bool bVar5;
  
  uVar3 = this->m_face_count;
  if (uVar3 == 2) {
    OVar2 = this->m_edge_tag;
    if (OVar2 != SmoothX) {
      if (OVar2 == Crease) {
        return InteriorCrease;
      }
      if (OVar2 != Smooth) {
        return Invalid;
      }
    }
    fVar1 = (this->m_sharpness).m_edge_sharpness[0];
    if ((((fVar1 == 0.0) && (!NAN(fVar1))) &&
        (fVar1 = (this->m_sharpness).m_edge_sharpness[1], fVar1 == 0.0)) && (!NAN(fVar1))) {
      return InteriorSmooth;
    }
    bVar5 = ON_SubDEdgeSharpness::IsSharp(&this->m_sharpness);
    if (bVar5) {
      return InteriorSharp;
    }
  }
  else {
    if (uVar3 == 1) {
      OVar4 = Boundary;
    }
    else if (uVar3 == 0) {
      OVar4 = Wire;
    }
    else {
      if (0xfff0 < uVar3) {
        return Invalid;
      }
      OVar4 = Nonmanifold;
    }
    if (this->m_edge_tag == Crease) {
      return OVar4;
    }
  }
  return Invalid;
}

Assistant:

ON_SubDEdgeType ON_SubDEdge::EdgeType() const
{
  if (0 == m_face_count)
  {
    if (ON_SubDEdgeTag::Crease == m_edge_tag)
      return ON_SubDEdgeType::Wire;
  }
  else if (1 == m_face_count)
  {
    if (ON_SubDEdgeTag::Crease == m_edge_tag)
      return ON_SubDEdgeType::Boundary;
  }
  else if (2 == m_face_count)
  {
    if (ON_SubDEdgeTag::Crease == m_edge_tag)
      return ON_SubDEdgeType::InteriorCrease;
    
    if (ON_SubDEdgeTag::Smooth == m_edge_tag || ON_SubDEdgeTag::SmoothX == m_edge_tag)
    {
      if (this->m_sharpness.IsZero())
        return ON_SubDEdgeType::InteriorSmooth;
      if (this->m_sharpness.IsSharp())
        return ON_SubDEdgeType::InteriorSharp;
    }
  }
  else if (m_face_count <= ON_SubDEdge::MaximumFaceCount)
  {
    if (ON_SubDEdgeTag::Crease == m_edge_tag)
      return ON_SubDEdgeType::Nonmanifold;
  }

  return ON_SubDEdgeType::Invalid;
}